

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

char * __thiscall spdlog::details::os::getenv_abi_cxx11_(os *this,char *__name)

{
  char *pcVar1;
  char *buf;
  allocator local_19;
  char *local_18;
  char *local_10;
  os *local_8;
  
  local_10 = __name;
  local_8 = this;
  pcVar1 = ::getenv(__name);
  local_18 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return (char *)this;
}

Assistant:

std::string SPDLOG_INLINE getenv(const char *field) {
#if defined(_MSC_VER)
    #if defined(__cplusplus_winrt)
    return std::string{};  // not supported under uwp
    #else
    size_t len = 0;
    char buf[128];
    bool ok = ::getenv_s(&len, buf, sizeof(buf), field) == 0;
    return ok ? buf : std::string{};
    #endif
#else  // revert to getenv
    char *buf = ::getenv(field);
    return buf ? buf : std::string{};
#endif
}